

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stderr.c
# Opt level: O0

zt_log_ty * zt_log_stderr(uint opts)

{
  zt_log_ty *pzVar1;
  zt_log_ty *log;
  uint in_stack_ffffffffffffffec;
  zt_log_vtbl_ty *in_stack_fffffffffffffff0;
  
  pzVar1 = zt_log_new(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  pthread_mutex_init((pthread_mutex_t *)&pzVar1->mutex,(pthread_mutexattr_t *)0x0);
  return pzVar1;
}

Assistant:

zt_log_ty *
zt_log_stderr(unsigned int opts) {
    zt_log_ty * log;

    log = zt_log_new(&vtbl, opts);

#ifdef WITH_THREADS
    pthread_mutex_init(&log->mutex, NULL);
#endif /* WITH_THREADS */

    return log;
}